

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftbsdf.c
# Opt level: O0

void compare_neighbor(ED *current,FT_Int x_offset,FT_Int y_offset,FT_Int width)

{
  ED *pEVar1;
  FT_Fixed FVar2;
  undefined1 local_40 [8];
  FT_16D16_Vec dist_vec;
  FT_16D16 dist;
  ED *to_check;
  FT_Int width_local;
  FT_Int y_offset_local;
  FT_Int x_offset_local;
  ED *current_local;
  
  pEVar1 = current + (long)(y_offset * width) + (long)x_offset;
  dist_vec.y._4_4_ = pEVar1->dist + -0x10000;
  if (dist_vec.y._4_4_ < current->dist) {
    local_40 = (undefined1  [8])((long)(x_offset << 0x10) + (pEVar1->prox).x);
    dist_vec.x = (long)(y_offset << 0x10) + (pEVar1->prox).y;
    FVar2 = FT_Vector_Length((FT_Vector *)local_40);
    if ((int)FVar2 < current->dist) {
      current->dist = (int)FVar2;
      (current->prox).x = (FT_Pos)local_40;
      (current->prox).y = dist_vec.x;
    }
  }
  return;
}

Assistant:

static void
  compare_neighbor( ED*     current,
                    FT_Int  x_offset,
                    FT_Int  y_offset,
                    FT_Int  width )
  {
    ED*           to_check;
    FT_16D16      dist;
    FT_16D16_Vec  dist_vec;


    to_check = current + ( y_offset * width ) + x_offset;

    /*
     * While checking for the nearest point we first approximate the
     * distance of `current` by adding the deviation (which is sqrt(2) at
     * most).  Only if the new value is less than the current value we
     * calculate the actual distances using `FT_Vector_Length`.  This last
     * step can be omitted by using squared distances.
     */

    /*
     * Approximate the distance.  We subtract 1 to avoid precision errors,
     * which could happen because the two directions can be opposite.
     */
    dist = to_check->dist - ONE;

    if ( dist < current->dist )
    {
      dist_vec = to_check->prox;

      dist_vec.x += x_offset * ONE;
      dist_vec.y += y_offset * ONE;
      dist = VECTOR_LENGTH_16D16( dist_vec );

      if ( dist < current->dist )
      {
        current->dist = dist;
        current->prox = dist_vec;
      }
    }
  }